

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O0

void restdamage(memfile *mf,level *lev,boolean ghostly)

{
  int8_t iVar1;
  int32_t iVar2;
  char *__src;
  char *shp;
  damage **ppdStack_30;
  char damaged_shops [5];
  damage **pnext;
  damage *tmp_dam;
  int counter;
  boolean ghostly_local;
  level *lev_local;
  memfile *mf_local;
  
  tmp_dam._0_4_ = mread32(mf);
  if ((int32_t)tmp_dam != 0) {
    pnext = (damage **)malloc(0x20);
    ppdStack_30 = &lev->damagelist;
    while (tmp_dam._0_4_ = (int32_t)tmp_dam + -1, -1 < (int32_t)tmp_dam) {
      iVar2 = mread32(mf);
      pnext[1] = (damage *)(long)iVar2;
      iVar2 = mread32(mf);
      pnext[2] = (damage *)(long)iVar2;
      iVar1 = mread8(mf);
      *(int8_t *)(pnext + 3) = iVar1;
      iVar1 = mread8(mf);
      *(int8_t *)((long)pnext + 0x19) = iVar1;
      iVar1 = mread8(mf);
      *(int8_t *)((long)pnext + 0x1a) = iVar1;
      if (ghostly != '\0') {
        pnext[1] = (damage *)((long)&pnext[1]->next + (ulong)(moves - lev->lastmoves));
      }
      __src = in_rooms(lev,*(xchar *)(pnext + 3),*(xchar *)((long)pnext + 0x19),0x12);
      strcpy((char *)((long)&shp + 3),__src);
      *pnext = (damage *)0x0;
      *ppdStack_30 = (damage *)pnext;
      ppdStack_30 = pnext;
      pnext = (damage **)malloc(0x20);
    }
    free(pnext);
  }
  return;
}

Assistant:

static void restdamage(struct memfile *mf, struct level *lev, boolean ghostly)
{
	int counter;
	struct damage *tmp_dam;
	struct damage **pnext;

	counter = mread32(mf);
	if (!counter)
	    return;

	tmp_dam = malloc(sizeof(struct damage));
	pnext = &(lev->damagelist);

	while (--counter >= 0) {
	    char damaged_shops[5], *shp = NULL;

	    tmp_dam->when = mread32(mf);
	    tmp_dam->cost = mread32(mf);
	    tmp_dam->place.x = mread8(mf);
	    tmp_dam->place.y = mread8(mf);
	    tmp_dam->typ = mread8(mf);

	    if (ghostly)
		tmp_dam->when += (moves - lev->lastmoves);
	    strcpy(damaged_shops,
		   in_rooms(lev, tmp_dam->place.x, tmp_dam->place.y, SHOPBASE));

/* TODO: Maybe we should consider doing this on level change. It definitely
   mustn't happen on save game restore, though, otherwise saving and restoring a
   game allows you to repair damage while the shopkeeper is asleep or
   paralyzed, something that wouldn't happen without this code running. */
#if 0
	    for (shp = damaged_shops; *shp; shp++) {
		struct monst *shkp = shop_keeper(lev, *shp);

		if (shkp && inhishop(shkp) &&
			repair_damage(lev, shkp, tmp_dam, TRUE))
		    break;
	    }
#endif

	    if (!shp || !*shp) {
		tmp_dam->next = 0;
		*pnext = tmp_dam;
		pnext = &(tmp_dam->next);
		tmp_dam = malloc(sizeof(*tmp_dam));
	    }
	}
	free(tmp_dam);
}